

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_parsed_ir.cpp
# Opt level: O2

string * __thiscall
diligent_spirv_cross::ParsedIR::get_decoration_string_abi_cxx11_
          (ParsedIR *this,ID id,Decoration decoration)

{
  bool bVar1;
  Meta *pMVar2;
  
  pMVar2 = find_meta(this,id);
  if ((pMVar2 != (Meta *)0x0) &&
     (bVar1 = Bitset::get(&(pMVar2->decoration).decoration_flags,decoration), bVar1)) {
    if (decoration == DecorationUserTypeGOOGLE) {
      return &(pMVar2->decoration).user_type;
    }
    if (decoration == DecorationHlslSemanticGOOGLE) {
      return &(pMVar2->decoration).hlsl_semantic;
    }
  }
  return &this->empty_string;
}

Assistant:

const string &ParsedIR::get_decoration_string(ID id, Decoration decoration) const
{
	auto *m = find_meta(id);
	if (!m)
		return empty_string;

	auto &dec = m->decoration;

	if (!dec.decoration_flags.get(decoration))
		return empty_string;

	switch (decoration)
	{
	case DecorationHlslSemanticGOOGLE:
		return dec.hlsl_semantic;

	case DecorationUserTypeGOOGLE:
		return dec.user_type;

	default:
		return empty_string;
	}
}